

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls-client.c
# Opt level: O0

int lws_ssl_client_connect1(lws *wsi)

{
  lws_ssl_capable_status lVar1;
  int n;
  lws *wsi_local;
  
  lVar1 = lws_tls_client_connect(wsi);
  switch(lVar1) {
  case LWS_SSL_CAPABLE_DONE:
    wsi_local._4_4_ = 1;
    break;
  case LWS_SSL_CAPABLE_MORE_SERVICE_WRITE:
    lws_callback_on_writable(wsi);
  case LWS_SSL_CAPABLE_MORE_SERVICE:
  case LWS_SSL_CAPABLE_MORE_SERVICE_READ:
    lwsi_set_state(wsi,0x204);
  default:
    wsi_local._4_4_ = 0;
    break;
  case LWS_SSL_CAPABLE_ERROR:
    wsi_local._4_4_ = -1;
  }
  return wsi_local._4_4_;
}

Assistant:

int
lws_ssl_client_connect1(struct lws *wsi)
{
	int n;

	n = lws_tls_client_connect(wsi);
	switch (n) {
	case LWS_SSL_CAPABLE_ERROR:
		return -1;
	case LWS_SSL_CAPABLE_DONE:
		return 1; /* connected */
	case LWS_SSL_CAPABLE_MORE_SERVICE_WRITE:
		lws_callback_on_writable(wsi);
		/* fallthru */
	case LWS_SSL_CAPABLE_MORE_SERVICE:
	case LWS_SSL_CAPABLE_MORE_SERVICE_READ:
		lwsi_set_state(wsi, LRS_WAITING_SSL);
		break;
	}

	return 0; /* retry */
}